

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

bool __thiscall Rml::ElementScroll::CreateScrollbar(ElementScroll *this,Orientation orientation)

{
  bool bVar1;
  char *__s;
  pointer pEVar2;
  pointer this_00;
  Element *pEVar3;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_160;
  Element *local_158;
  Element *child;
  Property local_148;
  Property local_f8;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a8;
  allocator<char> local_81;
  String local_80;
  allocator<char> local_49;
  String local_48;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_28;
  ElementPtr scrollbar_element;
  Orientation orientation_local;
  ElementScroll *this_local;
  
  scrollbar_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ = orientation;
  if ((this->scrollbars[orientation].element == (Element *)0x0) ||
     (bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&this->scrollbars[orientation].widget), !bVar1)) {
    pEVar3 = this->element;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"*",&local_49);
    __s = "scrollbarhorizontal";
    if (scrollbar_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
        _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ == VERTICAL) {
      __s = "scrollbarvertical";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
    local_a8.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map(&local_a8);
    Factory::InstanceElement((Factory *)&local_28,pEVar3,&local_48,&local_80,&local_a8);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::~flat_map(&local_a8);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::allocator<char>::~allocator(&local_81);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::allocator<char>::~allocator(&local_49);
    pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_28);
    this->scrollbars
    [scrollbar_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_].element = pEVar2;
    pEVar3 = this->scrollbars
             [scrollbar_element._M_t.
              super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
              super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_].element;
    Property::Property<int>(&local_f8,1,NUMBER,-1);
    Element::SetProperty(pEVar3,Clip,&local_f8);
    Property::~Property(&local_f8);
    pEVar3 = this->scrollbars
             [scrollbar_element._M_t.
              super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
              super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_].element;
    Property::Property<Rml::Style::Drag,Rml::Style::Drag>(&local_148,Block);
    Element::SetProperty(pEVar3,Drag,&local_148);
    Property::~Property(&local_148);
    MakeUnique<Rml::WidgetScroll,Rml::Element*&>(&child);
    ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::operator=
              (&this->scrollbars
                [scrollbar_element._M_t.
                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                 super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_].widget,
               (unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_> *)&child);
    ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::~unique_ptr
              ((unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_> *)&child);
    this_00 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
              operator->(&this->scrollbars
                          [scrollbar_element._M_t.
                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_].widget);
    WidgetScroll::Initialise
              (this_00,HORIZONTAL -
                       (scrollbar_element._M_t.
                        super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ == VERTICAL)
              );
    pEVar3 = this->element;
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr(&local_160,&local_28);
    pEVar3 = Element::AppendChild(pEVar3,&local_160,false);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_160);
    local_158 = pEVar3;
    UpdateScrollElementProperties(this,pEVar3);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_28);
  }
  return true;
}

Assistant:

bool ElementScroll::CreateScrollbar(Orientation orientation)
{
	if (scrollbars[orientation].element && scrollbars[orientation].widget)
		return true;

	ElementPtr scrollbar_element =
		Factory::InstanceElement(element, "*", orientation == VERTICAL ? "scrollbarvertical" : "scrollbarhorizontal", XMLAttributes());
	scrollbars[orientation].element = scrollbar_element.get();
	scrollbars[orientation].element->SetProperty(PropertyId::Clip, Property(1, Unit::NUMBER));
	scrollbars[orientation].element->SetProperty(PropertyId::Drag, Property(Style::Drag::Block));

	scrollbars[orientation].widget = MakeUnique<WidgetScroll>(scrollbars[orientation].element);
	scrollbars[orientation].widget->Initialise(orientation == VERTICAL ? WidgetScroll::VERTICAL : WidgetScroll::HORIZONTAL);

	Element* child = element->AppendChild(std::move(scrollbar_element), false);

	UpdateScrollElementProperties(child);

	return true;
}